

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O1

void __thiscall ClassLoader::setConstantPool(ClassLoader *this,FILE *fp,ClassFile *classFile)

{
  undefined4 in_EAX;
  uint uVar1;
  cp_info *pcVar2;
  undefined4 uStack_38;
  uint local_34;
  
  uVar1 = *(int *)&classFile->constant_pool_count - 1;
  _uStack_38 = CONCAT44(uVar1,in_EAX);
  pcVar2 = (cp_info *)malloc((ulong)((uVar1 & 0xffff) * 8) * 3);
  classFile->constant_pool = pcVar2;
  if ((short)uVar1 == 0) {
    return;
  }
  uStack_38 = (uint)(uint3)uStack_38;
  fread((void *)((long)&uStack_38 + 3),1,1,(FILE *)fp);
  pcVar2->tag = uStack_38._3_1_;
  if (uStack_38._3_1_ - 1 < 0xc) {
    (*(code *)(&DAT_001240a8 + *(int *)(&DAT_001240a8 + (ulong)(uStack_38._3_1_ - 1) * 4)))();
    return;
  }
  std::operator<<((ostream *)&std::cerr,
                  "Arquivo .class possui uma tag invalida no pool de constantes");
  exit(5);
}

Assistant:

void ClassLoader::setConstantPool(FILE *fp, ClassFile *classFile) {
    u2 poolSize = classFile->constant_pool_count - 1;
    classFile->constant_pool = (cp_info*) malloc(sizeof(cp_info) * poolSize);
    
    cp_info *constant_pool = classFile->constant_pool;
    for (u2 i = 0; i < poolSize; i++) {
        u1 tag = readU1(fp);
        constant_pool[i].tag = tag;
        
        switch (tag) {
            case CONSTANT_Class:
                constant_pool[i].info.class_info = getConstantClassInfo(fp);
            break;
            case CONSTANT_Fieldref:
                constant_pool[i].info.fieldref_info = getConstantFieldRefInfo(fp);
            break;
            case CONSTANT_Methodref:
                constant_pool[i].info.methodref_info = getConstantMethodRefInfo(fp);
            break;
            case CONSTANT_InterfaceMethodref:
                constant_pool[i].info.interfaceMethodref_info = getConstantInterfaceMethodRefInfo(fp);
            break;
            case CONSTANT_String:
                constant_pool[i].info.string_info = getConstantStringInfo(fp);
            break;
            case CONSTANT_Integer:
                constant_pool[i].info.integer_info = getConstantIntegerInfo(fp);
            break;
            case CONSTANT_Float:
                constant_pool[i].info.float_info = getConstantFloatInfo(fp);
            break;
            case CONSTANT_Long:
                constant_pool[i].info.long_info = getConstantLongInfo(fp);
                constant_pool[++i].tag = CONSTANT_NULL;
            break;
            case CONSTANT_Double:
                constant_pool[i].info.double_info = getConstantDoubleInfo(fp);
                constant_pool[++i].tag = CONSTANT_NULL;
            break;
            case CONSTANT_NameAndType:
                constant_pool[i].info.nameAndType_info = getConstantNameAndTypeInfo(fp);
            break;
            case CONSTANT_Utf8:
                constant_pool[i].info.utf8_info = getConstantUtf8Info(fp);
            break;
            default:
                cerr << "Arquivo .class possui uma tag invalida no pool de constantes";
                exit(5);
        }
    }
}